

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

FunctionBody * __thiscall
Js::ParseableFunctionInfo::ParseAsmJs
          (ParseableFunctionInfo *this,Parser *ps,CompileScriptException *se,
          ParseNodeProg **parseTree)

{
  undefined1 *puVar1;
  Type TVar2;
  byte bVar3;
  uint displayNameLength;
  LocalFunctionId functionId;
  uint uVar4;
  uint uVar5;
  NestedArray *pNVar6;
  char16 *displayName;
  FunctionInfo *pFVar7;
  SourceContextInfo *pSVar8;
  Type TVar9;
  code *pcVar10;
  char16_t *pcVar11;
  bool bVar12;
  int iVar13;
  HRESULT HVar14;
  HRESULT HVar15;
  undefined4 *puVar16;
  FunctionBody *functionBody;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Utf8SourceInfo *pUVar17;
  Type pSrc;
  ulong uVar18;
  Type local_58;
  Type local_54;
  uint nextFunctionId;
  FunctionBody *local_48;
  Type local_40;
  HRESULT local_38;
  Type local_34;
  HRESULT hrParser;
  
  if ((this->super_FunctionProxy).functionInfo.ptr == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                 ,0x53e,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar12) goto LAB_0076ce47;
    *puVar16 = 0;
  }
  if ((ParseableFunctionInfo *)
      (((this->super_FunctionProxy).functionInfo.ptr)->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                 ,0x53f,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                 "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar12) goto LAB_0076ce47;
    *puVar16 = 0;
  }
  if ((((this->super_FunctionProxy).functionInfo.ptr)->attributes & DeferredParse) == None) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                 ,0xa36,"(IsDeferredParseFunction())","IsDeferredParseFunction()");
    if (!bVar12) goto LAB_0076ce47;
    *puVar16 = 0;
  }
  if (((this->super_FunctionProxy).field_0x46 & 2) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                 ,0xa37,"(m_isAsmjsMode)","m_isAsmjsMode");
    if (!bVar12) goto LAB_0076ce47;
    *puVar16 = 0;
  }
  pNVar6 = (this->nestedArray).ptr;
  if (pNVar6 == (NestedArray *)0x0) {
    local_34 = 0;
  }
  else {
    local_34 = pNVar6->nestedCount;
  }
  local_40 = (this->super_FunctionProxy).m_scriptContext;
  displayName = (this->m_displayName).ptr;
  displayNameLength = this->m_displayNameLength;
  local_54 = this->m_displayShortNameOffset;
  pUVar17 = (this->super_FunctionProxy).m_utf8SourceInfo.ptr;
  _nextFunctionId = (ulong)(this->super_FunctionProxy).m_functionNumber;
  local_48 = (FunctionBody *)
             (ulong)((((pUVar17->m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
  if ((this->super_FunctionProxy).functionInfo.ptr == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                 ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar12) goto LAB_0076ce47;
    *puVar16 = 0;
  }
  pFVar7 = (this->super_FunctionProxy).functionInfo.ptr;
  functionId = pFVar7->functionId;
  if (pFVar7 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                 ,0x545,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar12) goto LAB_0076ce47;
    *puVar16 = 0;
  }
  if ((ParseableFunctionInfo *)
      (((this->super_FunctionProxy).functionInfo.ptr)->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                 ,0x546,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                 "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar12) goto LAB_0076ce47;
    *puVar16 = 0;
  }
  functionBody = FunctionBody::NewFromRecycler
                           (local_40,displayName,displayNameLength,local_54,local_34,pUVar17,
                            (uint)_nextFunctionId,(uint)local_48,functionId,
                            ((this->super_FunctionProxy).functionInfo.ptr)->attributes &
                            ~(DeferredParse|DeferredDeserialize),Flags_HasNoExplicitReturnValue);
  Copy(this,&functionBody->super_ParseableFunctionInfo);
  Utf8SourceInfo::SetFunctionBody
            ((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr,
             functionBody);
  pSVar8 = (((((this->super_FunctionProxy).m_utf8SourceInfo.ptr)->m_srcInfo).ptr)->sourceContextInfo
           ).ptr;
  TVar9 = pSVar8->dwHostSourceContext;
  TVar2 = pSVar8->isHostDynamicDocument;
  bVar12 = Phases::IsEnabled((Phases *)&DAT_015d3490,DeferParsePhase);
  if ((TVar9 == 0xffffffffffffffff) || ((TVar2 & 1U) != 0)) {
    if (bVar12) {
      uVar4 = (this->super_FunctionProxy).m_functionNumber;
      iVar13 = (*(this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
                 _vptr_IRecyclerVisitedObject[7])(this);
      pNVar6 = (this->nestedArray).ptr;
      if (pNVar6 == (NestedArray *)0x0) {
        uVar18 = 0;
      }
      else {
        uVar18 = (ulong)pNVar6->nestedCount;
      }
      pUVar17 = (this->super_FunctionProxy).m_utf8SourceInfo.ptr;
      pcVar11 = L"LdTrue";
      if (((this->super_FunctionProxy).field_0x44 & 2) == 0) {
        pcVar11 = L"LdFalse";
      }
      Output::Print(L"TestTrace: Deferred function parsed - ID: %d; Display Name: %s; Length: %d; Nested Function Count: %d; Utf8SourceInfo: %d; Source Length: %d\n; Is Top Level: %s;"
                    ,(ulong)uVar4,CONCAT44(extraout_var_00,iVar13),(ulong)this->m_cchLength,uVar18,
                    (ulong)pUVar17->m_sourceInfoId,(ulong)pUVar17->m_cchLength,pcVar11 + 2);
      goto LAB_0076cade;
    }
  }
  else if (bVar12) {
    uVar4 = (this->super_FunctionProxy).m_functionNumber;
    iVar13 = (*(this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
               _vptr_IRecyclerVisitedObject[7])(this);
    pNVar6 = (this->nestedArray).ptr;
    if (pNVar6 == (NestedArray *)0x0) {
      uVar18 = 0;
    }
    else {
      uVar18 = (ulong)pNVar6->nestedCount;
    }
    pUVar17 = (this->super_FunctionProxy).m_utf8SourceInfo.ptr;
    pcVar11 = L"LdTrue";
    if (((this->super_FunctionProxy).field_0x44 & 2) == 0) {
      pcVar11 = L"LdFalse";
    }
    Output::Print(L"TestTrace: Deferred function parsed - ID: %d; Display Name: %s; Length: %d; Nested Function Count: %d; Utf8SourceInfo: %d; Source Length: %d; Is Top Level: %s; Source Url: %s\n"
                  ,(ulong)uVar4,CONCAT44(extraout_var,iVar13),(ulong)this->m_cchLength,uVar18,
                  (ulong)pUVar17->m_sourceInfoId,(ulong)pUVar17->m_cchLength,pcVar11 + 2,
                  (((((pUVar17->m_srcInfo).ptr)->sourceContextInfo).ptr)->field_5).field_0.url);
LAB_0076cade:
    Output::Flush();
  }
  if ((functionBody->field_0x179 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                 ,0xa5a,"(!funcBody->HasExecutionDynamicProfileInfo())",
                                 "!funcBody->HasExecutionDynamicProfileInfo()");
    if (!bVar12) goto LAB_0076ce47;
    *puVar16 = 0;
  }
  local_38 = 0;
  pUVar17 = ScriptContext::GetSource
                      ((this->super_FunctionProxy).m_scriptContext,
                       (functionBody->super_ParseableFunctionInfo).m_sourceIndex);
  bVar3 = pUVar17->field_0xa8;
  _nextFunctionId = (ulong)this->m_cbStartOffset;
  local_34 = this->m_cchStartOffset;
  uVar4 = this->m_cbLength;
  pSrc = (Type)Utf8SourceInfo::GetSource
                         ((this->super_FunctionProxy).m_utf8SourceInfo.ptr,
                          L"ParseableFunctionInfo::GetStartOfDocument");
  uVar5 = (functionBody->super_ParseableFunctionInfo).m_grfscr;
  if ((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    local_48 = functionBody;
    local_40 = pSrc;
    Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                 ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar12) goto LAB_0076ce47;
    *puVar16 = 0;
    pSrc = local_40;
    functionBody = local_48;
  }
  local_58 = ((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->
             functionId;
  HVar14 = Parser::ParseSourceWithOffset
                     (ps,parseTree,(LPCUTF8)pSrc,_nextFunctionId,(ulong)uVar4,local_34,
                      (bool)((bVar3 & 2) >> 1),uVar5 | 0x1800000,se,&local_58,
                      (functionBody->super_ParseableFunctionInfo).m_lineNumber,
                      (((((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.
                          m_utf8SourceInfo.ptr)->m_srcInfo).ptr)->sourceContextInfo).ptr,
                      &functionBody->super_ParseableFunctionInfo);
  local_38 = HVar14;
  if (HVar14 < 0) {
LAB_0076cccd:
    HVar15 = MapDeferredReparseError(&local_38,se);
    if ((-1 < HVar15) || (local_38 < 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar16 = 1;
      bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                   ,0xa75,
                                   "(((HRESULT)(hrParseCodeGen)<0) && ((HRESULT)(hrParser) >= 0))",
                                   "Syntax errors should never be detected on deferred re-parse");
      if (!bVar12) goto LAB_0076ce47;
      *puVar16 = 0;
    }
  }
  else {
    if ((functionBody->super_ParseableFunctionInfo).deferredParseNextFunctionId != local_58) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar16 = 1;
      bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                   ,0xa71,
                                   "(((HRESULT)(hrParser)<0) || funcBody->deferredParseNextFunctionId == nextFunctionId)"
                                   ,
                                   "FAILED(hrParser) || funcBody->deferredParseNextFunctionId == nextFunctionId"
                                  );
      if (!bVar12) goto LAB_0076ce47;
      *puVar16 = 0;
    }
    HVar15 = 0;
    if (HVar14 < 0) goto LAB_0076cccd;
  }
  if (local_38 < 0) {
    Throw::InternalError();
  }
  if (-1 < HVar15) {
    FunctionProxy::UpdateFunctionBodyImpl(&this->super_FunctionProxy,functionBody);
    puVar1 = &(this->super_FunctionProxy).field_0x45;
    *puVar1 = *puVar1 | 2;
    bVar12 = FunctionProxy::IsFunctionBody((FunctionProxy *)functionBody);
    if (!bVar12) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar16 = 1;
      bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                   ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
      if (!bVar12) {
LAB_0076ce47:
        pcVar10 = (code *)invalidInstructionException();
        (*pcVar10)();
      }
      *puVar16 = 0;
    }
    return functionBody;
  }
  if (HVar15 != -0x7ff8fff2) {
    if (HVar15 == -0x7ff5ffe4) {
      Throw::StackOverflow((this->super_FunctionProxy).m_scriptContext,(PVOID)0x0);
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar12 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                 ,0xa84,"(hrParseCodeGen == ((HRESULT)0x8007000EL))",
                                 "hrParseCodeGen == E_OUTOFMEMORY");
    if (!bVar12) goto LAB_0076ce47;
    *puVar16 = 0;
  }
  Throw::OutOfMemory();
}

Assistant:

FunctionBody* ParseableFunctionInfo::ParseAsmJs(Parser * ps, __out CompileScriptException * se, __out ParseNodeProg ** parseTree)
    {
        Assert(IsDeferredParseFunction());
        Assert(m_isAsmjsMode);

        FunctionBody* returnFunctionBody = nullptr;
        FunctionBody* funcBody = nullptr;

        funcBody = FunctionBody::NewFromRecycler(
            this->m_scriptContext,
            this->m_displayName,
            this->m_displayNameLength,
            this->m_displayShortNameOffset,
            this->GetNestedCount(),
            this->GetUtf8SourceInfo(),
            this->m_functionNumber,
            this->GetUtf8SourceInfo()->GetSrcInfo()->sourceContextInfo->sourceContextId,
            this->GetLocalFunctionId(),
            (FunctionInfo::Attributes)(this->GetAttributes() & ~(FunctionInfo::Attributes::DeferredDeserialize | FunctionInfo::Attributes::DeferredParse)),
            Js::FunctionBody::FunctionBodyFlags::Flags_HasNoExplicitReturnValue
#ifdef PERF_COUNTERS
            , false /* is function from deferred deserialized proxy */
#endif
            );

        this->Copy(funcBody);
        PERF_COUNTER_DEC(Code, DeferredFunction);

        if (!this->GetSourceContextInfo()->IsDynamic())
        {
            PHASE_PRINT_TESTTRACE1(Js::DeferParsePhase, _u("TestTrace: Deferred function parsed - ID: %d; Display Name: %s; Length: %d; Nested Function Count: %d; Utf8SourceInfo: %d; Source Length: %d; Is Top Level: %s; Source Url: %s\n"), m_functionNumber, this->GetDisplayName(), this->m_cchLength, this->GetNestedCount(), this->m_utf8SourceInfo->GetSourceInfoId(), this->m_utf8SourceInfo->GetCchLength(), this->GetIsTopLevel() ? _u("True") : _u("False"), this->GetSourceContextInfo()->url);
        }
        else
        {
            PHASE_PRINT_TESTTRACE1(Js::DeferParsePhase, _u("TestTrace: Deferred function parsed - ID: %d; Display Name: %s; Length: %d; Nested Function Count: %d; Utf8SourceInfo: %d; Source Length: %d\n; Is Top Level: %s;"), m_functionNumber, this->GetDisplayName(), this->m_cchLength, this->GetNestedCount(), this->m_utf8SourceInfo->GetSourceInfoId(), this->m_utf8SourceInfo->GetCchLength(), this->GetIsTopLevel() ? _u("True") : _u("False"));
        }

#if ENABLE_PROFILE_INFO
        Assert(!funcBody->HasExecutionDynamicProfileInfo());
#endif

        HRESULT hrParser = NO_ERROR;
        HRESULT hrParseCodeGen = NO_ERROR;

        bool isCesu8 = m_scriptContext->GetSource(funcBody->GetSourceIndex())->IsCesu8();

        size_t offset = this->StartOffset();
        charcount_t charOffset = this->StartInDocument();
        size_t length = this->LengthInBytes();

        LPCUTF8 pszStart = this->GetStartOfDocument();

        uint32 grfscr = funcBody->GetGrfscr() | fscrDeferredFnc | fscrDeferredFncExpression;

        uint nextFunctionId = funcBody->GetLocalFunctionId();

        // if parser throws, it will be caught by function trying to bytecode gen the asm.js module, so don't need to catch/rethrow here
        hrParser = ps->ParseSourceWithOffset(parseTree, pszStart, offset, length, charOffset, isCesu8, grfscr, se,
                    &nextFunctionId, funcBody->GetRelativeLineNumber(), funcBody->GetSourceContextInfo(),
                    funcBody);

        Assert(FAILED(hrParser) || funcBody->deferredParseNextFunctionId == nextFunctionId);
        if (FAILED(hrParser))
        {
            hrParseCodeGen = MapDeferredReparseError(hrParser, *se); // Map certain errors like OOM/SOE
            AssertMsg(FAILED(hrParseCodeGen) && SUCCEEDED(hrParser), "Syntax errors should never be detected on deferred re-parse");
        }

        if (!SUCCEEDED(hrParser))
        {
            Throw::InternalError();
        }
        else if (!SUCCEEDED(hrParseCodeGen))
        {
            if (hrParseCodeGen == VBSERR_OutOfStack)
            {
                Throw::StackOverflow(m_scriptContext, nullptr);
            }
            else
            {
                Assert(hrParseCodeGen == E_OUTOFMEMORY);
                Throw::OutOfMemory();
            }
        }

        UpdateFunctionBodyImpl(funcBody);
        m_hasBeenParsed = true;

        Assert(funcBody->GetFunctionBody() == funcBody);

        returnFunctionBody = funcBody;

        return returnFunctionBody;
    }